

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectiveFile::initOpen(CDirectiveFile *this,path *fileName,int64_t memory)

{
  FileManager *this_00;
  path fullName;
  __shared_ptr<AssemblerFile,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [40];
  
  *(undefined4 *)&(this->super_CAssemblerCommand).field_0x14 = 1;
  local_48._0_8_ = memory;
  getFullPathName((path *)(local_48 + 8),fileName);
  std::make_shared<GenericAssemblerFile,ghc::filesystem::path&,long&,bool>
            ((path *)local_58,(long *)(local_48 + 8),(bool *)local_48);
  std::__shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  this_00 = g_fileManager;
  std::__shared_ptr<AssemblerFile,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<GenericAssemblerFile,void>
            (local_68,&(this->file).
                       super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>);
  FileManager::addFile(this_00,(shared_ptr<AssemblerFile> *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  Global.Section = Global.Section + 1;
  (this->super_CAssemblerCommand).section = Global.Section;
  ghc::filesystem::path::~path((path *)(local_48 + 8));
  return;
}

Assistant:

void CDirectiveFile::initOpen(const fs::path& fileName, int64_t memory)
{
	type = Type::Open;
	fs::path fullName = getFullPathName(fileName);

	file = std::make_shared<GenericAssemblerFile>(fullName,memory,false);
	g_fileManager->addFile(file);

	updateSection(++Global.Section);
}